

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_get_byseq(fdb_kvs_handle *handle,fdb_doc *doc)

{
  ulong uVar1;
  void *pvVar2;
  size_t sVar3;
  long lVar4;
  docio_length len;
  bool bVar5;
  uint uVar6;
  size_t sVar7;
  fdb_txn *pfVar8;
  void *__src;
  fdb_doc *doc_00;
  undefined4 in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff0c;
  undefined2 uVar9;
  uint8_t in_stack_ffffffffffffff0e;
  undefined1 uVar10;
  uint8_t in_stack_ffffffffffffff0f;
  undefined1 uVar11;
  docio_object *in_stack_ffffffffffffff10;
  fdb_doc *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff24;
  undefined1 in_stack_ffffffffffffff25;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  int size_chunk;
  bool alloc_body;
  bool alloc_meta;
  bool alloc_key;
  fdb_kvs_id_t _kv_id;
  fdb_txn *pfStack_c8;
  hbtrie_result hr;
  uint8_t *kv_seqnum;
  int size_seq;
  int size_id;
  size_t key_len;
  _fdb_key_cmp_info cmp_info;
  fdb_txn *txn;
  fdb_seqnum_t _seqnum;
  btree_result br;
  fdb_status wr;
  filemgr *wal_file;
  docio_handle *dhandle;
  docio_object _doc;
  int64_t _offset;
  uint64_t offset;
  fdb_doc *doc_local;
  fdb_kvs_handle *handle_local;
  
  pfVar8 = (fdb_txn *)&stack0xffffffffffffff08;
  offset = (uint64_t)doc;
  doc_local = (fdb_doc *)handle;
  docio_object::docio_object(in_stack_ffffffffffffff10);
  _br = 0;
  _seqnum._0_4_ = BTREE_RESULT_FAIL;
  if (doc_local == (fdb_doc *)0x0) {
    handle_local._4_4_ = FDB_RESULT_INVALID_HANDLE;
  }
  else if ((offset == 0) || (*(long *)(offset + 0x28) == -1)) {
    handle_local._4_4_ = FDB_RESULT_INVALID_ARGS;
  }
  else if (*(char *)&doc_local[1].body == '\x01') {
    doc_00 = (fdb_doc *)0x14f09f;
    bVar5 = atomic_cas_uint8_t((atomic<unsigned_char> *)in_stack_ffffffffffffff10,
                               in_stack_ffffffffffffff0f,in_stack_ffffffffffffff0e);
    if (bVar5) {
      if (doc_local[5].size_ondisk == 0) {
        doc_00 = (fdb_doc *)0x14f0ca;
        fdb_check_file_reopen((fdb_kvs_handle *)doc_local,(file_status_t *)0x0);
        cmp_info.kvs = *(kvs_info **)(*(long *)doc_local->seqnum + 0x1c8);
        if (cmp_info.kvs == (kvs_info *)0x0) {
          cmp_info.kvs = (kvs_info *)(*(long *)&doc_local->deleted + 0x130);
        }
      }
      else {
        cmp_info.kvs = *(kvs_info **)(doc_local[5].size_ondisk + 0x48);
      }
      key_len = doc_local->keylen;
      cmp_info.kvs_config._0_8_ = doc_local->metalen;
      cmp_info.kvs_config.custom_cmp = (fdb_custom_cmp_variable)doc_local->bodylen;
      cmp_info.kvs_config.custom_cmp_param = (void *)doc_local->size_ondisk;
      br._0_1_ = doc_local->deleted;
      br._1_3_ = *(undefined3 *)&doc_local->field_0x49;
      unique0x00012004 = doc_local->flags;
      wal_file = (filemgr *)doc_local[1].keylen;
      _size_seq = *(undefined8 *)offset;
      *(undefined8 *)offset = 0;
      if ((doc_local[4].size_ondisk & 0x1000000) == 0) {
        if (doc_local->size_ondisk == 0) {
          _seqnum._4_4_ =
               wal_find(pfStack_c8,(filemgr *)CONCAT44(_kv_id._4_4_,(undefined4)_kv_id),
                        (_fdb_key_cmp_info *)_size_chunk,
                        (snap_handle *)
                        CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT16(in_stack_ffffffffffffff26,
                                          CONCAT15(in_stack_ffffffffffffff25,
                                                   CONCAT14(in_stack_ffffffffffffff24,
                                                            in_stack_ffffffffffffff20)))),
                        in_stack_ffffffffffffff18,(uint64_t *)in_stack_ffffffffffffff10);
        }
        else {
          _seqnum._4_4_ =
               wal_find_kv_id(_size_chunk,
                              (filemgr *)
                              CONCAT17(in_stack_ffffffffffffff27,
                                       CONCAT16(in_stack_ffffffffffffff26,
                                                CONCAT15(in_stack_ffffffffffffff25,
                                                         CONCAT14(in_stack_ffffffffffffff24,
                                                                  in_stack_ffffffffffffff20)))),
                              (fdb_kvs_id_t)in_stack_ffffffffffffff18,
                              (_fdb_key_cmp_info *)in_stack_ffffffffffffff10,
                              (snap_handle *)
                              CONCAT17(in_stack_ffffffffffffff0f,
                                       CONCAT16(in_stack_ffffffffffffff0e,
                                                CONCAT24(in_stack_ffffffffffffff0c,
                                                         in_stack_ffffffffffffff08))),doc_00,
                              (uint64_t *)CONCAT44(kv_seqnum._4_4_,(int)kv_seqnum));
        }
      }
      else {
        _seqnum._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
      }
      *(undefined8 *)offset = _size_seq;
      if (doc_local[5].size_ondisk == 0) {
        fdb_sync_db_header((fdb_kvs_handle *)_doc.key);
      }
      atomic_incr_uint64_t
                ((atomic<unsigned_long> *)in_stack_ffffffffffffff10,
                 CONCAT13(in_stack_ffffffffffffff0f,
                          CONCAT12(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff0c)));
      if (_seqnum._4_4_ == FDB_RESULT_KEY_NOT_FOUND) {
        _fdb_sync_dirty_root
                  ((fdb_kvs_handle *)
                   CONCAT17(in_stack_ffffffffffffff27,
                            CONCAT16(in_stack_ffffffffffffff26,
                                     CONCAT15(in_stack_ffffffffffffff25,
                                              CONCAT14(in_stack_ffffffffffffff24,
                                                       in_stack_ffffffffffffff20)))));
        txn = (fdb_txn *)
              (*(ulong *)(offset + 0x28) >> 0x38 |
               (*(ulong *)(offset + 0x28) & 0xff000000000000) >> 0x28 |
               (*(ulong *)(offset + 0x28) & 0xff0000000000) >> 0x18 |
               (*(ulong *)(offset + 0x28) & 0xff00000000) >> 8 |
               (*(ulong *)(offset + 0x28) & 0xff000000) << 8 |
               (*(ulong *)(offset + 0x28) & 0xff0000) << 0x18 |
               (*(ulong *)(offset + 0x28) & 0xff00) << 0x28 | *(long *)(offset + 0x28) << 0x38);
        if (doc_local->size_ondisk == 0) {
          _seqnum._0_4_ = btree_find((btree *)doc_local->body,&txn,&_offset);
          pfVar8 = (fdb_txn *)&stack0xffffffffffffff08;
        }
        else {
          uVar1 = *(ulong *)(doc_local->size_ondisk + 8);
          uVar6 = (uint)uVar1;
          _size_chunk = (fdb_txn *)
                        (uVar1 >> 0x38 | (ulong)((uint)(uVar1 >> 0x28) & 0xff00) |
                         (ulong)((uint)(uVar1 >> 0x18) & 0xff0000) | (uVar1 & 0xff00000000) >> 8 |
                         (ulong)(uVar6 & 0xff000000) << 8 | (ulong)(uVar6 & 0xff0000) << 0x18 |
                         (ulong)(uVar6 & 0xff00) << 0x28 | uVar1 << 0x38);
          kv_seqnum._4_4_ = 8;
          kv_seqnum._0_4_ = 8;
          pfStack_c8 = (fdb_txn *)&stack0xfffffffffffffef8;
          memcpy((fdb_txn *)&stack0xfffffffffffffef8,&size_chunk,8);
          memcpy((undefined1 *)((long)&pfStack_c8->handle + (long)kv_seqnum._4_4_),&txn,
                 (long)(int)kv_seqnum);
          _kv_id._4_4_ = hbtrie_find((hbtrie *)doc_local->body,pfStack_c8,
                                     kv_seqnum._4_4_ + (int)kv_seqnum,&_offset);
          if (_kv_id._4_4_ == HBTRIE_RESULT_SUCCESS) {
            uVar9 = 0;
            uVar10 = 0;
            uVar11 = 0;
          }
          else {
            uVar9 = (undefined2)(btree_result)_seqnum;
            uVar10 = (undefined1)((btree_result)_seqnum >> 0x10);
            uVar11 = (undefined1)((btree_result)_seqnum >> 0x18);
          }
          _seqnum._0_4_ = CONCAT13(uVar11,CONCAT12(uVar10,uVar9));
          pfVar8 = (fdb_txn *)&stack0xfffffffffffffef8;
        }
        pfVar8[-1].wrapper = (wal_txn_wrapper *)0x14f4a7;
        btreeblk_end((btreeblk_handle *)pfVar8->prev_hdr_bid);
        _offset = (ulong)_offset >> 0x38 | (_offset & 0xff000000000000U) >> 0x28 |
                  (_offset & 0xff0000000000U) >> 0x18 | (_offset & 0xff00000000U) >> 8 |
                  (_offset & 0xff000000U) << 8 | (_offset & 0xff0000U) << 0x18 |
                  (_offset & 0xff00U) << 0x28 | _offset << 0x38;
        pfVar8[-1].wrapper = (wal_txn_wrapper *)0x14f550;
        _fdb_release_dirty_root((fdb_kvs_handle *)pfVar8->txn_id);
      }
      if (((_seqnum._4_4_ == FDB_RESULT_SUCCESS) && (_offset != -1)) ||
         ((btree_result)_seqnum != BTREE_RESULT_FAIL)) {
        if (doc_local->size_ondisk == 0) {
          _doc._16_8_ = *(undefined8 *)(offset + 0x20);
          dhandle._0_2_ = *(ushort *)offset;
        }
        else {
          _doc.timestamp = 0;
          _doc._20_4_ = 0;
        }
        _doc.field_3 = *(anon_union_8_2_18a01fae_for_docio_object_3 *)(offset + 0x38);
        _doc.meta = *(void **)(offset + 0x40);
        if ((_seqnum._4_4_ == FDB_RESULT_SUCCESS) && ((*(byte *)(offset + 0x48) & 1) != 0)) {
          *(undefined8 *)((long)pfVar8 + -8) = 0x14f61b;
          atomic_cas_uint8_t(*(atomic<unsigned_char> **)((long)pfVar8 + 8),
                             *(uint8_t *)((long)pfVar8 + 7),*(uint8_t *)((long)pfVar8 + 6));
          handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
        }
        else {
          *(undefined8 *)((long)pfVar8 + -8) = 0x14f63d;
          _doc.body = (void *)docio_read_doc(*(docio_handle **)((long)pfVar8 + 0x120),
                                             *(uint64_t *)((long)pfVar8 + 0x118),
                                             *(docio_object **)((long)pfVar8 + 0x110),
                                             *(bool *)((long)pfVar8 + 0x10f));
          if ((long)_doc.body < 1) {
            *(undefined8 *)((long)pfVar8 + -8) = 0x14f65f;
            atomic_cas_uint8_t(*(atomic<unsigned_char> **)((long)pfVar8 + 8),
                               *(uint8_t *)((long)pfVar8 + 7),*(uint8_t *)((long)pfVar8 + 6));
            if ((long)_doc.body < 0) {
              handle_local._4_4_ = (fdb_status)_doc.body;
            }
            else {
              handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
            }
          }
          else if ((_doc.length.bodylen & 4) == 0) {
            *(void **)(offset + 0x28) = _doc.key;
            if (doc_local->size_ondisk == 0) {
              *(ulong *)offset = (ulong)(ushort)dhandle;
              *(undefined8 *)(offset + 0x20) = _doc._16_8_;
            }
            else {
              uVar6 = (uint)*(ushort *)&doc_local[1].key;
              *(long *)offset = (long)(int)((ushort)dhandle - uVar6);
              if (*(long *)(offset + 0x20) == 0) {
                *(undefined8 *)(offset + 0x20) = _doc._16_8_;
                pvVar2 = *(void **)(offset + 0x20);
                lVar4 = *(long *)(offset + 0x20);
                sVar3 = *(size_t *)offset;
                *(undefined8 *)((long)pfVar8 + -8) = 0x14f798;
                memmove(pvVar2,(void *)(lVar4 + (int)uVar6),sVar3);
              }
              else {
                pvVar2 = *(void **)(offset + 0x20);
                __src = (void *)(_doc._16_8_ + (long)(int)uVar6);
                sVar3 = *(size_t *)offset;
                *(undefined8 *)((long)pfVar8 + -8) = 0x14f752;
                memcpy(pvVar2,__src,sVar3);
                *(undefined8 *)((long)pfVar8 + -8) = 0x14f764;
                free_docio_object(*(docio_object **)((long)pfVar8 + 8),
                                  *(uint8_t *)((long)pfVar8 + 7),*(uint8_t *)((long)pfVar8 + 6),
                                  *(uint8_t *)((long)pfVar8 + 5));
              }
            }
            *(ulong *)(offset + 8) = (ulong)dhandle._2_2_;
            *(ulong *)(offset + 0x10) = (ulong)dhandle._4_4_;
            *(anon_union_8_2_18a01fae_for_docio_object_3 *)(offset + 0x38) = _doc.field_3;
            *(void **)(offset + 0x40) = _doc.meta;
            *(bool *)(offset + 0x48) = (_doc.length.bodylen & 4) != 0;
            len.metalen = dhandle._2_2_;
            len.keylen = (ushort)dhandle;
            len.bodylen = dhandle._4_4_;
            len.flag = (undefined1)_doc.length.bodylen;
            len.checksum = _doc.length.bodylen._1_1_;
            len.reserved = _doc.length.bodylen._2_2_;
            len.bodylen_ondisk._0_2_ = _doc.length.keylen;
            len.bodylen_ondisk._2_2_ = _doc.length.metalen;
            *(undefined8 *)((long)pfVar8 + -8) = 0x14f826;
            sVar7 = _fdb_get_docsize(len);
            *(size_t *)(offset + 0x18) = sVar7;
            *(int64_t *)(offset + 0x30) = _offset;
            *(undefined8 *)((long)pfVar8 + -8) = 0x14f854;
            atomic_cas_uint8_t(*(atomic<unsigned_char> **)((long)pfVar8 + 8),
                               *(uint8_t *)((long)pfVar8 + 7),*(uint8_t *)((long)pfVar8 + 6));
            handle_local._4_4_ = FDB_RESULT_SUCCESS;
          }
          else {
            *(undefined8 *)((long)pfVar8 + -8) = 0x14f6b0;
            atomic_cas_uint8_t(*(atomic<unsigned_char> **)((long)pfVar8 + 8),
                               *(uint8_t *)((long)pfVar8 + 7),*(uint8_t *)((long)pfVar8 + 6));
            *(undefined8 *)((long)pfVar8 + -8) = 0x14f6dc;
            free_docio_object(*(docio_object **)((long)pfVar8 + 8),*(uint8_t *)((long)pfVar8 + 7),
                              *(uint8_t *)((long)pfVar8 + 6),*(uint8_t *)((long)pfVar8 + 5));
            handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
          }
        }
      }
      else {
        *(undefined8 *)((long)pfVar8 + -8) = 0x14f874;
        atomic_cas_uint8_t(*(atomic<unsigned_char> **)((long)pfVar8 + 8),
                           *(uint8_t *)((long)pfVar8 + 7),*(uint8_t *)((long)pfVar8 + 6));
        handle_local._4_4_ = FDB_RESULT_KEY_NOT_FOUND;
      }
    }
    else {
      handle_local._4_4_ = FDB_RESULT_HANDLE_BUSY;
    }
  }
  else {
    handle_local._4_4_ = FDB_RESULT_INVALID_CONFIG;
  }
  return handle_local._4_4_;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_byseq(fdb_kvs_handle *handle, fdb_doc *doc)
{
    uint64_t offset;
    int64_t _offset;
    struct docio_object _doc;
    struct docio_handle *dhandle;
    struct filemgr *wal_file = NULL;
    fdb_status wr;
    btree_result br = BTREE_RESULT_FAIL;
    fdb_seqnum_t _seqnum;
    fdb_txn *txn;
    struct _fdb_key_cmp_info cmp_info;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc || doc->seqnum == SEQNUM_NOT_USED) {
        return FDB_RESULT_INVALID_ARGS;
    }

    // Sequence trees are a must for byseq operations
    if (handle->config.seqtree_opt != FDB_SEQTREE_USE) {
        return FDB_RESULT_INVALID_CONFIG;
    }

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);

        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;
    wal_file = handle->file;
    dhandle = handle->dhandle;

    // prevent searching by key in WAL if 'doc' is not empty
    size_t key_len = doc->keylen;
    doc->keylen = 0;

    if (handle->config.do_not_search_wal) {
        wr = FDB_RESULT_KEY_NOT_FOUND;
    } else {
        if (handle->kvs) {
            wr = wal_find_kv_id(txn, wal_file, handle->kvs->id, &cmp_info,
                                handle->shandle, doc, &offset);
        } else {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, doc, &offset);
        }
    }

    doc->keylen = key_len;
    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }

    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    if (wr == FDB_RESULT_KEY_NOT_FOUND) {
        _fdb_sync_dirty_root(handle);

        _seqnum = _endian_encode(doc->seqnum);
        if (handle->kvs) {
            int size_id, size_seq;
            uint8_t *kv_seqnum;
            hbtrie_result hr;
            fdb_kvs_id_t _kv_id;

            _kv_id = _endian_encode(handle->kvs->id);
            size_id = sizeof(fdb_kvs_id_t);
            size_seq = sizeof(fdb_seqnum_t);
            kv_seqnum = alca(uint8_t, size_id + size_seq);
            memcpy(kv_seqnum, &_kv_id, size_id);
            memcpy(kv_seqnum + size_id, &_seqnum, size_seq);
            hr = hbtrie_find(handle->seqtrie, (void *)kv_seqnum,
                             size_id + size_seq, (void *)&offset);
            br = (hr == HBTRIE_RESULT_SUCCESS)?(BTREE_RESULT_SUCCESS):(br);
        } else {
            br = btree_find(handle->seqtree, (void *)&_seqnum, (void *)&offset);
        }
        btreeblk_end(handle->bhandle);
        offset = _endian_decode(offset);

        _fdb_release_dirty_root(handle);
    }

    if ((wr == FDB_RESULT_SUCCESS && offset != BLK_NOT_FOUND) ||
         br != BTREE_RESULT_FAIL) {
        bool alloc_key, alloc_meta, alloc_body;
        if (!handle->kvs) { // single KVS mode
            _doc.key = doc->key;
            _doc.length.keylen = doc->keylen;
            alloc_key = doc->key ? false : true;
        } else {
            _doc.key = NULL;
            alloc_key = true;
        }
        alloc_meta = doc->meta ? false : true;
        _doc.meta = doc->meta;
        alloc_body = doc->body ? false : true;
        _doc.body = doc->body;

        if (wr == FDB_RESULT_SUCCESS && doc->deleted) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        _offset = docio_read_doc(dhandle, offset, &_doc, true);
        if (_offset <= 0) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return _offset < 0 ? (fdb_status)_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.flag & DOCIO_DELETED) {
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            free_docio_object(&_doc, alloc_key, alloc_meta, alloc_body);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        doc->seqnum = _doc.seqnum;
        if (handle->kvs) {
            int size_chunk = handle->config.chunksize;
            doc->keylen = _doc.length.keylen - size_chunk;
            if (doc->key) { // doc->key is given by user
                memcpy(doc->key, (uint8_t*)_doc.key + size_chunk, doc->keylen);
                free_docio_object(&_doc, 1, 0, 0);
            } else {
                doc->key = _doc.key;
                memmove(doc->key, (uint8_t*)doc->key + size_chunk, doc->keylen);
            }
        } else {
            doc->keylen = _doc.length.keylen;
            doc->key = _doc.key;
        }
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}